

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t cmp_node_mbs(archive_rb_node *n1,archive_rb_node *n2)

{
  wchar_t wVar1;
  char *p2;
  char *p1;
  char *local_20;
  char *local_18;
  
  archive_mstring_get_mbs((archive *)0x0,(archive_mstring *)(n1[1].rb_nodes + 1),&local_18);
  archive_mstring_get_mbs((archive *)0x0,(archive_mstring *)(n2[1].rb_nodes + 1),&local_20);
  if (local_18 == (char *)0x0) {
    wVar1 = L'\x01';
  }
  else if (local_20 == (char *)0x0) {
    wVar1 = L'\xffffffff';
  }
  else {
    wVar1 = strcmp(local_18,local_20);
  }
  return wVar1;
}

Assistant:

static int
cmp_node_mbs(const struct archive_rb_node *n1,
    const struct archive_rb_node *n2)
{
	struct match_file *f1 = (struct match_file *)(uintptr_t)n1;
	struct match_file *f2 = (struct match_file *)(uintptr_t)n2;
	const char *p1, *p2;

	archive_mstring_get_mbs(NULL, &(f1->pathname), &p1);
	archive_mstring_get_mbs(NULL, &(f2->pathname), &p2);
	if (p1 == NULL)
		return (1);
	if (p2 == NULL)
		return (-1);
	return (strcmp(p1, p2));
}